

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O3

int If_LibBoxLoad(char *pFileName)

{
  char *__filename;
  FILE *__stream;
  If_LibBox_t *pLib;
  If_LibBox_t *p;
  
  __filename = Extra_FileNameGenericAppend(pFileName,".cdl");
  __stream = fopen(__filename,"r");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    pLib = If_LibBoxRead2(__filename);
    p = (If_LibBox_t *)Abc_FrameReadLibBox();
    If_LibBoxFree(p);
    Abc_FrameSetLibBox(pLib);
  }
  return (uint)(__stream != (FILE *)0x0);
}

Assistant:

int If_LibBoxLoad( char * pFileName )
{
    FILE * pFile;
    If_LibBox_t * pLib;
    char * pFileNameOther;
    // check if library can be read
    pFileNameOther = Extra_FileNameGenericAppend( pFileName, ".cdl" );
    pFile = fopen( pFileNameOther, "r" );
    if ( pFile == NULL )
        return 0;
    fclose( pFile );
    // read library
    pLib = If_LibBoxRead2( pFileNameOther );
    // replace the current library
    If_LibBoxFree( (If_LibBox_t *)Abc_FrameReadLibBox() );
    Abc_FrameSetLibBox( pLib );
    return 1;
}